

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_mergeBlocks(_Qiniu_Qetag_Context *ctx)

{
  Qiniu_Crypto_Result QVar1;
  Qiniu_Qetag_Block *pQVar2;
  bool bVar3;
  Qiniu_Error QVar4;
  _Qiniu_Qetag_Block *blk;
  uchar digest [20];
  _Qiniu_Qetag_Context *ctx_local;
  Qiniu_Error err;
  
  unique0x1000015e = ctx;
  while( true ) {
    bVar3 = false;
    if (stack0xffffffffffffffe0->blkUnused < stack0xffffffffffffffe0->blkElementCount) {
      bVar3 = ((uint)stack0xffffffffffffffe0->blkArray[stack0xffffffffffffffe0->blkBegin].field_0 >>
               0x17 & 1) == 1;
    }
    if (!bVar3) {
      ctx_local._0_4_ = 200;
      err._0_8_ = anon_var_dwarf_bac7;
      goto LAB_0011bb8e;
    }
    pQVar2 = stack0xffffffffffffffe0->blkArray + stack0xffffffffffffffe0->blkBegin;
    QVar1 = Qiniu_Digest_Final(pQVar2->sha1Digest,(uchar *)&blk,(size_t *)0x0);
    if (QVar1 != QINIU_CRYPTO_RESULT_OK) {
      ctx_local._0_4_ = 9999;
      err._0_8_ = anon_var_dwarf_badd;
      goto LAB_0011bb8e;
    }
    QVar1 = Qiniu_Digest_Update(stack0xffffffffffffffe0->sha1Digest,&blk,0x14);
    if (QVar1 != QINIU_CRYPTO_RESULT_OK) break;
    pQVar2->field_0 =
         (anon_struct_4_3_eb54787e_for__Qiniu_Qetag_Block_0)((uint)pQVar2->field_0 & 0xff7fffff);
    stack0xffffffffffffffe0->blkBegin = stack0xffffffffffffffe0->blkBegin + 1;
    if (stack0xffffffffffffffe0->blkElementCount <= stack0xffffffffffffffe0->blkBegin) {
      stack0xffffffffffffffe0->blkBegin = 0;
    }
    stack0xffffffffffffffe0->blkUnused = stack0xffffffffffffffe0->blkUnused + 1;
  }
  ctx_local._0_4_ = 9999;
  err._0_8_ = anon_var_dwarf_badd;
LAB_0011bb8e:
  QVar4._4_4_ = 0;
  QVar4.code = (uint)ctx_local;
  QVar4.message = (char *)err._0_8_;
  return QVar4;
}

Assistant:

static Qiniu_Error Qiniu_Qetag_mergeBlocks(struct _Qiniu_Qetag_Context * ctx) {
    Qiniu_Error err;
    unsigned char digest[SHA_DIGEST_LENGTH];
    struct _Qiniu_Qetag_Block * blk = NULL;

    while (ctx->blkUnused < ctx->blkElementCount && ctx->blkArray[ctx->blkBegin].done == YES) {
        blk = &ctx->blkArray[ctx->blkBegin];

		if (Qiniu_Digest_Final(blk->sha1Digest, digest, NULL) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

		if (Qiniu_Digest_Update(ctx->sha1Digest, digest, sizeof(digest)) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

        blk->done = NO;

        ctx->blkBegin += 1;
        if (ctx->blkBegin >= ctx->blkElementCount) {
            ctx->blkBegin = 0;
        }
        ctx->blkUnused += 1;
    } // while

    err.code = 200;
    err.message = "ok";
    return err;
}